

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

string * __thiscall
QUtil::toUTF8_abi_cxx11_(string *__return_storage_ptr__,QUtil *this,unsigned_long uval)

{
  runtime_error *this_00;
  QUtil *pQVar1;
  logic_error *this_01;
  unsigned_long uVar2;
  int local_48;
  byte local_41;
  char *pcStack_40;
  uchar maxval;
  uchar *cur_byte;
  char local_2e [3];
  uchar bytes [7];
  QUtil *local_18;
  unsigned_long uval_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((QUtil *)0x7fffffff < this) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"bounds error in QUtil::toUTF8");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this < (QUtil *)0x80) {
    local_18._0_1_ = (char)this;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)local_18);
  }
  else {
    local_2e[1] = 0;
    pcStack_40 = local_2e;
    local_41 = 0x3f;
    local_18 = this;
    while( true ) {
      pQVar1 = (QUtil *)QIntC::to_ulong<unsigned_char>(&local_41);
      if (local_18 <= pQVar1) break;
      *pcStack_40 = ((byte)local_18 & 0x3f) + 0x80;
      local_18 = (QUtil *)((ulong)local_18 >> 6);
      local_41 = (byte)((int)(uint)local_41 >> 1);
      if (pcStack_40 <= (char *)((long)&cur_byte + 5U)) {
        this_01 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_01,"QUtil::toUTF8: overflow error");
        __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pcStack_40 = pcStack_40 + -1;
    }
    local_48 = (uint)local_41 * -2 + 0xfe;
    uVar2 = QIntC::to_ulong<int>(&local_48);
    *pcStack_40 = (char)uVar2 + (byte)local_18;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcStack_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::toUTF8(unsigned long uval)
{
    std::string result;

    // A UTF-8 encoding of a Unicode value is a single byte for Unicode values <= 127.  For larger
    // values, the first byte of the UTF-8 encoding has '1' as each of its n highest bits and '0'
    // for its (n+1)th highest bit where n is the total number of bytes required.  Subsequent bytes
    // start with '10' and have the remaining 6 bits free for encoding.  For example, an 11-bit
    // Unicode value can be stored in two bytes where the first is 110zzzzz, the second is 10zzzzzz,
    // and the z's represent the remaining bits.

    if (uval > 0x7fffffff) {
        throw std::runtime_error("bounds error in QUtil::toUTF8");
    } else if (uval < 128) {
        result += static_cast<char>(uval);
    } else {
        unsigned char bytes[7];
        bytes[6] = '\0';
        unsigned char* cur_byte = &bytes[5];

        // maximum value that will fit in the current number of bytes
        unsigned char maxval = 0x3f; // six bits

        while (uval > QIntC::to_ulong(maxval)) {
            // Assign low six bits plus 10000000 to lowest unused byte position, then shift
            *cur_byte = static_cast<unsigned char>(0x80 + (uval & 0x3f));
            uval >>= 6;
            // Maximum that will fit in high byte now shrinks by one bit
            maxval = static_cast<unsigned char>(maxval >> 1);
            // Slide to the left one byte
            if (cur_byte <= bytes) {
                throw std::logic_error("QUtil::toUTF8: overflow error");
            }
            --cur_byte;
        }
        // If maxval is k bits long, the high (7 - k) bits of the resulting byte must be high.
        *cur_byte = static_cast<unsigned char>(QIntC::to_ulong(0xff - (1 + (maxval << 1))) + uval);

        result += reinterpret_cast<char*>(cur_byte);
    }

    return result;
}